

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

char * get_gl_err_str(GLenum err)

{
  char *pcStack_10;
  GLenum err_local;
  
  if (err == 0) {
    pcStack_10 = "No error";
  }
  else if (err == 0x500) {
    pcStack_10 = "Invalid enum";
  }
  else if (err == 0x501) {
    pcStack_10 = "Invalid value";
  }
  else if (err == 0x502) {
    pcStack_10 = "Invalid operation";
  }
  else if (err == 0x503) {
    pcStack_10 = "Stack overflow";
  }
  else if (err == 0x504) {
    pcStack_10 = "Stack underflow";
  }
  else if (err == 0x505) {
    pcStack_10 = "Out of memory";
  }
  else {
    pcStack_10 = "Unknown error";
  }
  return pcStack_10;
}

Assistant:

const char * get_gl_err_str(GLenum err) {
    switch (err) {
        case GL_NO_ERROR:
            return "No error";
        case GL_INVALID_ENUM:
            return "Invalid enum";
        case GL_INVALID_VALUE:
            return "Invalid value";
        case GL_INVALID_OPERATION:
            return "Invalid operation";
        case GL_STACK_OVERFLOW:
            return "Stack overflow";
        case GL_STACK_UNDERFLOW:
            return "Stack underflow";
        case GL_OUT_OF_MEMORY:
            return "Out of memory";
        default:
            return "Unknown error";
    }
}